

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCut.c
# Opt level: O2

void * Abc_NodeGetCuts(void *p,Abc_Obj_t *pObj,int fDag,int fTree)

{
  int iVar1;
  int *piVar2;
  Cut_Params_t *pCVar3;
  Vec_Int_t *p_00;
  Cut_Cut_t *pCVar4;
  void **ppvVar5;
  uint uVar6;
  byte bVar7;
  uint uVar8;
  bool bVar9;
  
  if ((pObj->vFanins).nSize == 2) {
    uVar8 = 0;
    bVar7 = 0;
    if (1 < (pObj->vFanouts).nSize) {
      iVar1 = Abc_NodeIsMuxControlType(pObj);
      if (iVar1 == 0) {
        Cut_ManIncrementDagNodes((Cut_Man_t *)p);
        bVar7 = 1;
      }
      else {
        bVar7 = 0;
      }
    }
    if (fTree != 0) {
      piVar2 = (pObj->vFanins).pArray;
      ppvVar5 = pObj->pNtk->vObjs->pArray;
      uVar8 = 0;
      uVar6 = 0;
      if (1 < (((Abc_Obj_t *)ppvVar5[*piVar2])->vFanouts).nSize) {
        iVar1 = Abc_NodeIsMuxControlType((Abc_Obj_t *)ppvVar5[*piVar2]);
        uVar6 = (uint)(iVar1 == 0);
        piVar2 = (pObj->vFanins).pArray;
        ppvVar5 = pObj->pNtk->vObjs->pArray;
      }
      if (1 < (((Abc_Obj_t *)ppvVar5[piVar2[1]])->vFanouts).nSize) {
        iVar1 = Abc_NodeIsMuxControlType((Abc_Obj_t *)ppvVar5[piVar2[1]]);
        uVar8 = (uint)(iVar1 == 0) * 2;
      }
      uVar8 = uVar8 | uVar6;
    }
    pCVar3 = Cut_ManReadParams((Cut_Man_t *)p);
    if (pCVar3->fLocal == 0) {
      bVar9 = (bool)(fDag == 0 | bVar7);
    }
    else {
      p_00 = Cut_ManReadNodeAttrs((Cut_Man_t *)p);
      iVar1 = Vec_IntEntry(p_00,pObj->Id);
      if (iVar1 != 0) {
        Cut_ManIncrementDagNodes((Cut_Man_t *)p);
      }
      iVar1 = Vec_IntEntry(p_00,pObj->Id);
      bVar9 = iVar1 == 0;
      uVar8 = Vec_IntEntry(p_00,*(int *)((long)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray] +
                                        0x10));
      iVar1 = Vec_IntEntry(p_00,*(int *)((long)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[1]]
                                        + 0x10));
      uVar8 = iVar1 * 2 | uVar8;
    }
    piVar2 = (pObj->vFanins).pArray;
    pCVar4 = Cut_NodeComputeCuts((Cut_Man_t *)p,pObj->Id,*piVar2,piVar2[1],
                                 *(uint *)&pObj->field_0x14 >> 10 & 1,
                                 *(uint *)&pObj->field_0x14 >> 0xb & 1,(uint)bVar9,uVar8);
    return pCVar4;
  }
  __assert_fail("Abc_ObjFaninNum(pObj) == 2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcCut.c"
                ,0x1b6,"void *Abc_NodeGetCuts(void *, Abc_Obj_t *, int, int)");
}

Assistant:

void * Abc_NodeGetCuts( void * p, Abc_Obj_t * pObj, int fDag, int fTree )
{
    Abc_Obj_t * pFanin;
    int fDagNode, fTriv, TreeCode = 0;
//    assert( Abc_NtkIsStrash(pObj->pNtk) );
    assert( Abc_ObjFaninNum(pObj) == 2 );

    // check if the node is a DAG node
    fDagNode = (Abc_ObjFanoutNum(pObj) > 1 && !Abc_NodeIsMuxControlType(pObj));
    // increment the counter of DAG nodes
    if ( fDagNode ) Cut_ManIncrementDagNodes( (Cut_Man_t *)p );
    // add the trivial cut if the node is a DAG node, or if we compute all cuts
    fTriv = fDagNode || !fDag;
    // check if fanins are DAG nodes
    if ( fTree )
    {
        pFanin = Abc_ObjFanin0(pObj);
        TreeCode |=  (Abc_ObjFanoutNum(pFanin) > 1 && !Abc_NodeIsMuxControlType(pFanin));
        pFanin = Abc_ObjFanin1(pObj);
        TreeCode |= ((Abc_ObjFanoutNum(pFanin) > 1 && !Abc_NodeIsMuxControlType(pFanin)) << 1);
    }

    // changes due to the global/local cut computation
    {
        Cut_Params_t * pParams = Cut_ManReadParams((Cut_Man_t *)p);
        if ( pParams->fLocal )
        {
            Vec_Int_t * vNodeAttrs = Cut_ManReadNodeAttrs((Cut_Man_t *)p);
            fDagNode = Vec_IntEntry( vNodeAttrs, pObj->Id );
            if ( fDagNode ) Cut_ManIncrementDagNodes( (Cut_Man_t *)p );
//            fTriv = fDagNode || !pParams->fGlobal;
            fTriv = !Vec_IntEntry( vNodeAttrs, pObj->Id );
            TreeCode = 0;
            pFanin = Abc_ObjFanin0(pObj);
            TreeCode |=  Vec_IntEntry( vNodeAttrs, pFanin->Id );
            pFanin = Abc_ObjFanin1(pObj);
            TreeCode |= (Vec_IntEntry( vNodeAttrs, pFanin->Id ) << 1);
        }
    }
    return Cut_NodeComputeCuts( (Cut_Man_t *)p, pObj->Id, Abc_ObjFaninId0(pObj), Abc_ObjFaninId1(pObj),  
        Abc_ObjFaninC0(pObj), Abc_ObjFaninC1(pObj), fTriv, TreeCode );  
}